

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockSettingsRenameNodeReferences(ImGuiID old_node_id,ImGuiID new_node_id)

{
  ImGuiWindow_conflict **ppIVar1;
  ImGuiWindow_conflict *pIVar2;
  char *pcVar3;
  ImGuiContext_conflict1 *pIVar4;
  long lVar5;
  ImGuiWindowSettings *p;
  long lVar6;
  
  pIVar4 = GImGui;
  lVar5 = (long)(GImGui->Windows).Size;
  if (0 < lVar5) {
    ppIVar1 = (GImGui->Windows).Data;
    lVar6 = 0;
    do {
      pIVar2 = ppIVar1[lVar6];
      if ((pIVar2->DockId == old_node_id) && (pIVar2->DockNode == (ImGuiDockNode *)0x0)) {
        pIVar2->DockId = new_node_id;
      }
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  pcVar3 = (pIVar4->SettingsWindows).Buf.Data;
  if (pcVar3 != (char *)0x0) {
    p = (ImGuiWindowSettings *)(pcVar3 + 4);
    do {
      if (p->DockId == old_node_id) {
        p->DockId = new_node_id;
      }
      p = ImChunkStream<ImGuiWindowSettings>::next_chunk(&pIVar4->SettingsWindows,p);
    } while (p != (ImGuiWindowSettings *)0x0);
  }
  return;
}

Assistant:

static void ImGui::DockSettingsRenameNodeReferences(ImGuiID old_node_id, ImGuiID new_node_id)
{
    ImGuiContext& g = *GImGui;
    IMGUI_DEBUG_LOG_DOCKING("DockSettingsRenameNodeReferences: from 0x%08X -> to 0x%08X\n", old_node_id, new_node_id);
    for (int window_n = 0; window_n < g.Windows.Size; window_n++)
    {
        ImGuiWindow* window = g.Windows[window_n];
        if (window->DockId == old_node_id && window->DockNode == NULL)
            window->DockId = new_node_id;
    }
    //// FIXME-OPT: We could remove this loop by storing the index in the map
    for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
        if (settings->DockId == old_node_id)
            settings->DockId = new_node_id;
}